

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void __thiscall CVmObjHTTPRequest::load_image_data(CVmObjHTTPRequest *this,char *ptr,size_t siz)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,this);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  (this->super_CVmObject).ext_ = pcVar2;
  return;
}

Assistant:

void CVmObjHTTPRequest::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    notify_delete(vmg_ FALSE);

    /* allocate the extension */
    vm_httpreq_ext *ext = vm_httpreq_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;
}